

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_task.c
# Opt level: O3

uint32_t ticks_to_msec(my_clock_t ticks)

{
  return (uint32_t)((ulong)ticks * 0x3ffed0 >> 0x16);
}

Assistant:

uint32_t ticks_to_msec(my_clock_t ticks) {
#if INT_MAX < 65536 /* it seems that stm8 uint64 is uint32 */
    uint32_t msec = 1000 * (uint32_t)ticks / MY_CLOCKS_PER_SEC;
    return msec;
#else
    uint64_t u64_msec = 1000 * (uint64_t)ticks * TICKS_PER_SEC_1 / TICKS_DEVIDER;
    uint32_t msec = (u64_msec > (uint64_t)~(uint32_t)0
        ? ~(uint32_t)0 : (uint32_t)u64_msec);
    return msec;
#endif
}